

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

void __thiscall
chrono::ChContactContainerSMC::ArchiveOUT(ChContactContainerSMC *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChContactContainerSMC>(marchive);
  ChContactContainer::ArchiveOUT(&this->super_ChContactContainer,marchive);
  return;
}

Assistant:

void ChContactContainerSMC::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChContactContainerSMC>();
    // serialize parent class
    ChContactContainer::ArchiveOUT(marchive);
    // serialize all member data:
    // NO SERIALIZATION of contact list because assume it is volatile and generated when needed
}